

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.h
# Opt level: O2

tadsobj_objid_and_ptr * __thiscall CVmObjTadsInhQueue::create_path(CVmObjTadsInhQueue *this)

{
  pfq_ele *ppVar1;
  uint uVar2;
  tadsobj_objid_and_ptr *ptVar3;
  CVmObjTadsInhQueue *pCVar4;
  tadsobj_objid_and_ptr *ptVar5;
  
  uVar2 = 0;
  pCVar4 = this;
  while (ppVar1 = pCVar4->head_, ppVar1 != (pfq_ele *)0x0) {
    uVar2 = (uVar2 + 1) - (uint)(ppVar1->obj == 0);
    pCVar4 = (CVmObjTadsInhQueue *)&ppVar1->nxt;
  }
  ptVar3 = (tadsobj_objid_and_ptr *)malloc((ulong)uVar2 * 0x10 + 0x10);
  ptVar5 = ptVar3;
  while (ppVar1 = this->head_, ppVar1 != (pfq_ele *)0x0) {
    if (ppVar1->obj != 0) {
      ptVar5->id = ppVar1->obj;
      ptVar5->objp = ppVar1->objp;
      ptVar5 = ptVar5 + 1;
    }
    this = (CVmObjTadsInhQueue *)&ppVar1->nxt;
  }
  ptVar5->id = 0;
  ptVar5->objp = (CVmObjTads *)0x0;
  return ptVar3;
}

Assistant:

tadsobj_objid_and_ptr *create_path() const
    {
        /* count the elements in the queue */
        int cnt;
        pfq_ele *cur;
        for (cnt = 0, cur = head_ ; cur != 0 ; cur = cur->nxt)
        {
            /* only non-nil elements count */
            if (cur->obj != VM_INVALID_OBJ)
                ++cnt;
        }

        /* allocate the path */
        tadsobj_objid_and_ptr *path = (tadsobj_objid_and_ptr *)t3malloc(
            (cnt + 1) * sizeof(tadsobj_objid_and_ptr));

        /* initialize the path */
        tadsobj_objid_and_ptr *dst;
        for (dst = path, cur = head_ ; cur != 0 ; cur = cur->nxt)
        {
            /* only store non-nil elements */
            if (cur->obj != VM_INVALID_OBJ)
            {
                dst->id = cur->obj;
                dst->objp = cur->objp;
                ++dst;
            }
        }

        /* set the null last entry */
        dst->id = VM_INVALID_OBJ;
        dst->objp = 0;

        /* return the new path */
        return path;
    }